

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O3

HMInteger __thiscall hypermind::CompileUnit::CreateLable(CompileUnit *this)

{
  uint uVar1;
  VM *pVVar2;
  HMUINT32 HVar3;
  uint *puVar4;
  uint uVar5;
  
  uVar5 = (this->mLables).count;
  uVar1 = (this->mLables).capacity;
  HVar3 = uVar5 + 1;
  if (uVar1 < HVar3) {
    pVVar2 = this->mVM;
    HVar3 = CeilToPowerOf2(HVar3);
    (this->mLables).capacity = HVar3;
    puVar4 = (uint *)GCHeap::MemManger(&pVVar2->mGCHeap,(this->mLables).data,(ulong)uVar1 << 2,
                                       (ulong)HVar3 << 2);
    (this->mLables).data = puVar4;
    uVar5 = (this->mLables).count;
    HVar3 = uVar5 + 1;
  }
  else {
    puVar4 = (this->mLables).data;
  }
  (this->mLables).count = HVar3;
  puVar4[uVar5] = 0;
  return (this->mLables).count - 1;
}

Assistant:

HMInteger CreateLable() {
            return mLables.push(&mVM->mGCHeap, 0);
        }